

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::NormalGetFullPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact,bool realname)

{
  undefined1 *puVar1;
  bool bVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string local_d8;
  string local_a0;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  GetDirectory(&local_a0,this,config,artifact);
  local_60.first._M_len = local_a0._M_string_length;
  local_60.first._M_str = local_a0._M_dataplus._M_p;
  puVar1 = (undefined1 *)((long)&local_d8.field_2 + 8);
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 1;
  local_d8.field_2._M_local_buf[8] = '/';
  local_48 = 1;
  local_38 = 0;
  views._M_len = 2;
  views._M_array = &local_60;
  local_d8.field_2._M_allocated_capacity = (size_type)puVar1;
  local_60.second = &local_a0;
  local_40 = puVar1;
  cmCatViews(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  bVar2 = cmTarget::IsAppBundleOnApple(this->Target);
  if (bVar2) {
    BuildBundleDirectory(&local_80,this,__return_storage_ptr__,config,FullLevel);
    local_60.first._M_len = local_80._M_string_length;
    local_60.first._M_str = local_80._M_dataplus._M_p;
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 1;
    local_d8.field_2._M_local_buf[8] = '/';
    local_48 = 1;
    local_38 = 0;
    views_00._M_len = 2;
    views_00._M_array = &local_60;
    local_d8.field_2._M_allocated_capacity = (size_type)puVar1;
    local_60.second = &local_80;
    local_40 = puVar1;
    cmCatViews(&local_a0,views_00);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if (artifact == ImportLibraryArtifact) {
    if (realname) {
      NormalGetRealName(&local_d8,this,config,ImportLibraryArtifact);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    }
    else {
      GetFullName(&local_d8,this,config,ImportLibraryArtifact);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    }
  }
  else {
    if (artifact != RuntimeBinaryArtifact) {
      return __return_storage_ptr__;
    }
    if (realname) {
      NormalGetRealName(&local_d8,this,config,RuntimeBinaryArtifact);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    }
    else {
      GetFullName(&local_d8,this,config,RuntimeBinaryArtifact);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  bool realname) const
{
  std::string fpath = cmStrCat(this->GetDirectory(config, artifact), '/');
  if (this->IsAppBundleOnApple()) {
    fpath =
      cmStrCat(this->BuildBundleDirectory(fpath, config, FullLevel), '/');
  }

  // Add the full name of the target.
  switch (artifact) {
    case cmStateEnums::RuntimeBinaryArtifact:
      if (realname) {
        fpath += this->NormalGetRealName(config);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
      }
      break;
    case cmStateEnums::ImportLibraryArtifact:
      if (realname) {
        fpath +=
          this->NormalGetRealName(config, cmStateEnums::ImportLibraryArtifact);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::ImportLibraryArtifact);
      }
      break;
  }
  return fpath;
}